

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool cmInstallCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  string_view key;
  initializer_list<std::pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>
  init;
  bool bVar1;
  int iVar2;
  cmMakefile *this;
  cmGlobalGenerator *this_00;
  const_reference this_01;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_220;
  string_view local_218;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_208;
  string_view local_200;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_1f0;
  string_view local_1e8;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_1d8;
  string_view local_1d0;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_1c0;
  string_view local_1b8;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_1a8;
  string_view local_1a0;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_190;
  string_view local_188;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_178;
  string_view local_170;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_160;
  string_view local_158;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_148 [3];
  string_view local_130;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_120;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_108;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_f0;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_d8;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_c0;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_a8;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_90;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_78;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_60;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_48;
  iterator local_30;
  undefined8 local_28;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar1) {
    args_local._7_1_ = true;
  }
  else {
    this = cmExecutionStatus::GetMakefile(local_20);
    this_00 = cmMakefile::GetGlobalGenerator(this);
    cmGlobalGenerator::EnableInstallTarget(this_00);
    if (cmInstallCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::subcommand == '\0') {
      iVar2 = __cxa_guard_acquire(&cmInstallCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::subcommand);
      if (iVar2 != 0) {
        local_130 = (string_view)cm::operator____s("SCRIPT",6);
        local_148[0] = anon_unknown.dwarf_a590ed::HandleScriptMode;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_120,(static_string_view *)&local_130,local_148);
        local_158 = (string_view)cm::operator____s("CODE",4);
        local_160 = anon_unknown.dwarf_a590ed::HandleScriptMode;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_108,(static_string_view *)&local_158,&local_160)
        ;
        local_170 = (string_view)cm::operator____s("TARGETS",7);
        local_178 = anon_unknown.dwarf_a590ed::HandleTargetsMode;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_f0,(static_string_view *)&local_170,&local_178);
        local_188 = (string_view)cm::operator____s("IMPORTED_RUNTIME_ARTIFACTS",0x1a);
        local_190 = anon_unknown.dwarf_a590ed::HandleImportedRuntimeArtifactsMode;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_d8,(static_string_view *)&local_188,&local_190);
        local_1a0 = (string_view)cm::operator____s("FILES",5);
        local_1a8 = anon_unknown.dwarf_a590ed::HandleFilesMode;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_c0,(static_string_view *)&local_1a0,&local_1a8);
        local_1b8 = (string_view)cm::operator____s("PROGRAMS",8);
        local_1c0 = anon_unknown.dwarf_a590ed::HandleFilesMode;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_a8,(static_string_view *)&local_1b8,&local_1c0);
        local_1d0 = (string_view)cm::operator____s("DIRECTORY",9);
        local_1d8 = anon_unknown.dwarf_a590ed::HandleDirectoryMode;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_90,(static_string_view *)&local_1d0,&local_1d8);
        local_1e8 = (string_view)cm::operator____s("EXPORT",6);
        local_1f0 = anon_unknown.dwarf_a590ed::HandleExportMode;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_78,(static_string_view *)&local_1e8,&local_1f0);
        local_200 = (string_view)cm::operator____s("EXPORT_ANDROID_MK",0x11);
        local_208 = anon_unknown.dwarf_a590ed::HandleExportAndroidMKMode;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_60,(static_string_view *)&local_200,&local_208);
        local_218 = (string_view)cm::operator____s("RUNTIME_DEPENDENCY_SET",0x16);
        local_220 = anon_unknown.dwarf_a590ed::HandleRuntimeDependencySetMode;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_48,(static_string_view *)&local_218,&local_220);
        local_30 = &local_120;
        local_28 = 10;
        init._M_len = 10;
        init._M_array = local_30;
        cmSubcommandTable::cmSubcommandTable(&cmInstallCommand::subcommand,init);
        __cxa_atexit(cmSubcommandTable::~cmSubcommandTable,&cmInstallCommand::subcommand,
                     &__dso_handle);
        __cxa_guard_release(&cmInstallCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                             ::subcommand);
      }
    }
    this_01 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local,0);
    key = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
    args_local._7_1_ =
         cmSubcommandTable::operator()
                   (&cmInstallCommand::subcommand,key,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)status_local,local_20);
  }
  return args_local._7_1_;
}

Assistant:

bool cmInstallCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  // Allow calling with no arguments so that arguments may be built up
  // using a variable that may be left empty.
  if (args.empty()) {
    return true;
  }

  // Enable the install target.
  status.GetMakefile().GetGlobalGenerator()->EnableInstallTarget();

  static cmSubcommandTable const subcommand{
    { "SCRIPT"_s, HandleScriptMode },
    { "CODE"_s, HandleScriptMode },
    { "TARGETS"_s, HandleTargetsMode },
    { "IMPORTED_RUNTIME_ARTIFACTS"_s, HandleImportedRuntimeArtifactsMode },
    { "FILES"_s, HandleFilesMode },
    { "PROGRAMS"_s, HandleFilesMode },
    { "DIRECTORY"_s, HandleDirectoryMode },
    { "EXPORT"_s, HandleExportMode },
    { "EXPORT_ANDROID_MK"_s, HandleExportAndroidMKMode },
    { "RUNTIME_DEPENDENCY_SET"_s, HandleRuntimeDependencySetMode },
  };

  return subcommand(args[0], args, status);
}